

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O0

object * lookupMethod(object *selector,object *class)

{
  uintptr_t uVar1;
  ulong *puVar2;
  object *right;
  uint uVar3;
  int iVar4;
  uint local_48;
  int mid;
  int high;
  int low;
  object *val;
  object *vals;
  object *keys;
  object *dict;
  object *class_local;
  object *selector_local;
  
  if ((selector == (object *)0x0) || (selector == nilObject)) {
    info_impl("lookupMethod",0x9a,"lookupMethod(): selector is NULL or nil!");
  }
  else if ((class == (object *)0x0) || (dict = class, class == nilObject)) {
    info_impl("lookupMethod",0x9f,
              "lookupMethod(): lookup called with selector %.*s on NULL/nil class object!",
              selector->header >> 2 & 0x3fffffff,selector + 1);
  }
  else {
    for (; dict != nilObject; dict = dict[1].class) {
      info_impl("lookupMethod",0xa7,"looking up #%.*s in class %.*s.",
                selector->header >> 2 & 0x3fffffff,selector + 1,
                *(ulong *)dict[1].header >> 2 & 0x3fffffff,dict[1].header + 0x10);
      uVar1 = dict[2].header;
      puVar2 = *(ulong **)(uVar1 + 0x10);
      mid = 0;
      uVar3 = (uint)(*puVar2 >> 2) & 0x3fffffff;
      while (local_48 = uVar3, mid < (int)local_48) {
        uVar3 = (int)(mid + local_48) / 2;
        right = (object *)puVar2[(long)(int)uVar3 + 2];
        if (right == selector) {
          return *(object **)(*(long *)(uVar1 + 0x18) + 0x10 + (long)(int)uVar3 * 8);
        }
        iVar4 = symbolcomp(selector,right);
        if (-1 < iVar4) {
          mid = uVar3 + 1;
          uVar3 = local_48;
        }
      }
    }
  }
  return (object *)0x0;
}

Assistant:

static struct object *lookupMethod(struct object *selector, struct object *class)
{
    struct object *dict, *keys, *vals, *val;
    int low, high, mid;

    if(!selector || selector == nilObject) {
        info("lookupMethod(): selector is NULL or nil!");
        return NULL;
    }

    if(!class || class == nilObject) {
        info("lookupMethod(): lookup called with selector %.*s on NULL/nil class object!", SIZE(selector), bytePtr(selector));
        return NULL;
    }

    /*
     * Scan upward through the class hierarchy
     */
    for ( ; class != nilObject; class = class->data[parentClassInClass]) {
        info("looking up #%.*s in class %.*s.", SIZE(selector), (char*)bytePtr(selector), SIZE(class->data[nameInClass]), (char*)bytePtr(class->data[nameInClass]));
        /*
         * Consider the Dictionary of methods for this Class
         */
        dict = class->data[methodsInClass];
        keys = dict->data[0];
        low = 0;
        high = SIZE(keys);

        /*
         * Do a binary search through its keys, which are
         * Symbol's.
         */
        while (low < high) {
            mid = (low + high) / 2;
            val = keys->data[mid];

            /*
             * If we find the selector, return the
             * method object.
             */
            if (val == selector) {
                vals = dict->data[1];
                return(vals->data[mid]);
            }

            /*
             * Otherwise continue the binary search
             */
            if (symbolcomp(selector, val) < 0) {
                high = mid;
            } else {
                low = mid+1;
            }
        }
    }

    /*
     * Sorry, couldn't find a method
     */
    return NULL;
}